

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

int __thiscall
Fl_PostScript_Graphics_Driver::start_postscript
          (Fl_PostScript_Graphics_Driver *this,int pagecount,Page_Format format,Page_Layout layout)

{
  uint uVar1;
  uint local_24;
  int x;
  int h;
  int w;
  Page_Layout layout_local;
  Page_Format format_local;
  int pagecount_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  if (format == A4) {
    this->left_margin = 0x12;
    this->top_margin = 0x12;
  }
  else {
    this->left_margin = 0xc;
    this->top_margin = 0xc;
  }
  this->page_format_ = format | layout;
  if ((layout & LANDSCAPE) == PORTRAIT) {
    this->pw_ = (double)Fl_Paged_Device::page_formats[format].width;
    this->ph_ = (double)Fl_Paged_Device::page_formats[format].height;
  }
  else {
    this->ph_ = (double)Fl_Paged_Device::page_formats[format].width;
    this->pw_ = (double)Fl_Paged_Device::page_formats[format].height;
  }
  fputs("%!PS-Adobe-3.0\n",(FILE *)this->output);
  fputs("%%Creator: FLTK\n",(FILE *)this->output);
  if (1 < this->lang_level_) {
    fprintf((FILE *)this->output,"%%%%LanguageLevel: %i\n",(ulong)(uint)this->lang_level_);
  }
  this->pages_ = pagecount;
  if (pagecount == 0) {
    fputs("%%Pages: (atend)\n",(FILE *)this->output);
  }
  else {
    fprintf((FILE *)this->output,"%%%%Pages: %i\n",(ulong)(uint)pagecount);
  }
  fprintf((FILE *)this->output,"%%%%BeginFeature: *PageSize %s\n",
          Fl_Paged_Device::page_formats[format].name);
  x = Fl_Paged_Device::page_formats[format].width;
  uVar1 = Fl_Paged_Device::page_formats[format].height;
  local_24 = uVar1;
  if ((this->lang_level_ == 3) && ((layout & LANDSCAPE) != PORTRAIT)) {
    local_24 = x;
    x = uVar1;
  }
  fprintf((FILE *)this->output,"<</PageSize[%d %d]>>setpagedevice\n",(ulong)(uint)x,(ulong)local_24)
  ;
  fputs("%%EndFeature\n",(FILE *)this->output);
  fputs("%%EndComments\n",(FILE *)this->output);
  fputs(prolog,(FILE *)this->output);
  if (1 < this->lang_level_) {
    fputs(prolog_2,(FILE *)this->output);
  }
  if (this->lang_level_ == 2) {
    fputs(prolog_2_pixmap,(FILE *)this->output);
  }
  if (2 < this->lang_level_) {
    fputs(prolog_3,(FILE *)this->output);
  }
  if (this->lang_level_ < 3) {
    fputs("/CS { GS } bind def\n",(FILE *)this->output);
    fputs("/CR { GR } bind def\n",(FILE *)this->output);
  }
  else {
    fputs("/CS { clipsave } bind def\n",(FILE *)this->output);
    fputs("/CR { cliprestore } bind def\n",(FILE *)this->output);
  }
  this->page_policy_ = 1;
  fputs("%%EndProlog\n",(FILE *)this->output);
  if (1 < this->lang_level_) {
    fprintf((FILE *)this->output,"<< /Policies << /Pagesize 1 >> >> setpagedevice\n");
  }
  reset(this);
  this->nPages = 0;
  return 0;
}

Assistant:

int Fl_PostScript_Graphics_Driver::start_postscript (int pagecount, 
    enum Fl_Paged_Device::Page_Format format, enum Fl_Paged_Device::Page_Layout layout)
//returns 0 iff OK
{
  int w, h, x;
  if (format == Fl_Paged_Device::A4) {
    left_margin = 18;
    top_margin = 18;
  }
  else {
    left_margin = 12;
    top_margin = 12;
  }
  page_format_ = (enum Fl_Paged_Device::Page_Format)(format | layout);
  if (layout & Fl_Paged_Device::LANDSCAPE){
    ph_ = Fl_Paged_Device::page_formats[format].width;
    pw_ = Fl_Paged_Device::page_formats[format].height;
  } else {
    pw_ = Fl_Paged_Device::page_formats[format].width;
    ph_ = Fl_Paged_Device::page_formats[format].height;
  }
  
  fputs("%!PS-Adobe-3.0\n", output);
  fputs("%%Creator: FLTK\n", output);
  if (lang_level_>1)
    fprintf(output, "%%%%LanguageLevel: %i\n" , lang_level_);
  if ((pages_ = pagecount))
    fprintf(output, "%%%%Pages: %i\n", pagecount);
  else
    fputs("%%Pages: (atend)\n", output);
  fprintf(output, "%%%%BeginFeature: *PageSize %s\n", Fl_Paged_Device::page_formats[format].name );
  w = Fl_Paged_Device::page_formats[format].width;
  h = Fl_Paged_Device::page_formats[format].height;
  if (lang_level_ == 3 && (layout & Fl_Paged_Device::LANDSCAPE) ) { x = w; w = h; h = x; }
  fprintf(output, "<</PageSize[%d %d]>>setpagedevice\n", w, h );
  fputs("%%EndFeature\n", output);
  fputs("%%EndComments\n", output);
  fputs(prolog, output);
  if (lang_level_ > 1) {
    fputs(prolog_2, output);
    }
  if (lang_level_ == 2) {
    fputs(prolog_2_pixmap, output);
    }
  if (lang_level_ > 2)
    fputs(prolog_3, output);
  if (lang_level_ >= 3) {
    fputs("/CS { clipsave } bind def\n", output);
    fputs("/CR { cliprestore } bind def\n", output);
  } else {
    fputs("/CS { GS } bind def\n", output);
    fputs("/CR { GR } bind def\n", output);
  }
  page_policy_ = 1;
  
  
  fputs("%%EndProlog\n",output);
  if (lang_level_ >= 2)
    fprintf(output,"<< /Policies << /Pagesize 1 >> >> setpagedevice\n");
  
  reset();
  nPages=0;
  return 0;
}